

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeNumberConstructor
               (DynamicObject *numberConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Var pvVar3;
  DynamicObject **ppDVar4;
  PropertyString *value;
  void **ppvVar5;
  ScriptConfiguration *this_01;
  JavascriptFunction **ppJVar6;
  undefined4 *puVar7;
  double local_40;
  double next;
  double epsilon;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *numberConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,numberConstructor,mode,0x11,0);
  this = RecyclableObject::GetScriptContext(&numberConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&numberConstructor->super_RecyclableObject);
  pvVar3 = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,numberConstructor,0xd1,pvVar3,'\x02');
  ppDVar4 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).numberPrototype);
  AddMember(this_00,numberConstructor,0x124,*ppDVar4,'\0');
  value = ScriptContext::GetPropertyString(this,0x10b);
  AddMember(this_00,numberConstructor,0x106,value,'\x02');
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).maxValue);
  AddMember(this_00,numberConstructor,0x100,*ppvVar5,'\0');
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).minValue);
  AddMember(this_00,numberConstructor,0x104,*ppvVar5,'\0');
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).nan);
  AddMember(this_00,numberConstructor,0x105,*ppvVar5,'\0');
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).negativeInfinite);
  AddMember(this_00,numberConstructor,0x10e,*ppvVar5,'\0');
  ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).positiveInfinite);
  AddMember(this_00,numberConstructor,0x121,*ppvVar5,'\0');
  this_01 = ScriptContext::GetConfig(this);
  bVar2 = ScriptConfiguration::IsES6NumberExtensionsEnabled(this_01);
  if (bVar2) {
    next = 0.0;
    for (local_40 = 1.0; (local_40 + 1.0 != 1.0 || (NAN(local_40 + 1.0))); local_40 = local_40 / 2.0
        ) {
      next = local_40;
    }
    if ((next != 2.220446049250313e-16) || (NAN(next))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0xfdf,"(epsilon == Math::EPSILON)","epsilon == Math::EPSILON");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pvVar3 = JavascriptNumber::New(2.220446049250313e-16,this);
    AddMember(this_00,numberConstructor,0x7d,pvVar3,'\0');
    pvVar3 = JavascriptNumber::New(9007199254740991.0,this);
    AddMember(this_00,numberConstructor,0xff,pvVar3,'\0');
    pvVar3 = JavascriptNumber::New(-9007199254740991.0,this);
    AddMember(this_00,numberConstructor,0x103,pvVar3,'\0');
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->parseIntFunctionObject);
    if (*ppJVar6 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0xfe5,"(library->parseIntFunctionObject != nullptr)",
                                  "Where is parseIntFunctionObject? Should have been initialized with Global object initialization"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->parseFloatFunctionObject);
    if (*ppJVar6 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0xfe6,"(library->parseFloatFunctionObject != nullptr)",
                                  "Where is parseIntFunctionObject? Should have been initialized with Global object initialization"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->parseIntFunctionObject);
    AddMember(this_00,numberConstructor,0x11f,*ppJVar6);
    ppJVar6 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this_00->parseFloatFunctionObject);
    AddMember(this_00,numberConstructor,0x11e,*ppJVar6);
    AddFunctionToLibraryObject
              (this_00,numberConstructor,0xc4,(FunctionInfo *)JavascriptNumber::EntryInfo::IsNaN,1,
               '\x06');
    AddFunctionToLibraryObject
              (this_00,numberConstructor,0xc1,(FunctionInfo *)JavascriptNumber::EntryInfo::IsFinite,
               1,'\x06');
    AddFunctionToLibraryObject
              (this_00,numberConstructor,0xc3,(FunctionInfo *)JavascriptNumber::EntryInfo::IsInteger
               ,1,'\x06');
    AddFunctionToLibraryObject
              (this_00,numberConstructor,0xc6,
               (FunctionInfo *)JavascriptNumber::EntryInfo::IsSafeInteger,1,'\x06');
  }
  DynamicObject::SetHasNoEnumerableProperties(numberConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeNumberConstructor(DynamicObject* numberConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(numberConstructor, mode, 17);

        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterNumber
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = numberConstructor->GetScriptContext();
        JavascriptLibrary* library = numberConstructor->GetLibrary();
        library->AddMember(numberConstructor, PropertyIds::length,            TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(numberConstructor, PropertyIds::prototype,         library->numberPrototype,     PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Number), PropertyConfigurable);
        library->AddMember(numberConstructor, PropertyIds::MAX_VALUE,         library->maxValue,            PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::MIN_VALUE,         library->minValue,            PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::NaN,               library->nan,                 PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::NEGATIVE_INFINITY, library->negativeInfinite,    PropertyNone);
        library->AddMember(numberConstructor, PropertyIds::POSITIVE_INFINITY, library->positiveInfinite,    PropertyNone);

        if (scriptContext->GetConfig()->IsES6NumberExtensionsEnabled())
        {
#ifdef DBG
            double epsilon = 0.0;
            for (double next = 1.0; next + 1.0 != 1.0; next = next / 2.0)
            {
                epsilon = next;
            }
            Assert(epsilon == Math::EPSILON);
#endif
            library->AddMember(numberConstructor, PropertyIds::EPSILON,     JavascriptNumber::New(Math::EPSILON,     scriptContext), PropertyNone);
            library->AddMember(numberConstructor, PropertyIds::MAX_SAFE_INTEGER, JavascriptNumber::New(Math::MAX_SAFE_INTEGER, scriptContext), PropertyNone);
            library->AddMember(numberConstructor, PropertyIds::MIN_SAFE_INTEGER, JavascriptNumber::New(Math::MIN_SAFE_INTEGER, scriptContext), PropertyNone);

            AssertMsg(library->parseIntFunctionObject != nullptr, "Where is parseIntFunctionObject? Should have been initialized with Global object initialization");
            AssertMsg(library->parseFloatFunctionObject != nullptr, "Where is parseIntFunctionObject? Should have been initialized with Global object initialization");
            library->AddMember(numberConstructor, PropertyIds::parseInt, library->parseIntFunctionObject);
            library->AddMember(numberConstructor, PropertyIds::parseFloat, library->parseFloatFunctionObject);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isNaN, &JavascriptNumber::EntryInfo::IsNaN, 1);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isFinite, &JavascriptNumber::EntryInfo::IsFinite, 1);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isInteger, &JavascriptNumber::EntryInfo::IsInteger, 1);
            library->AddFunctionToLibraryObject(numberConstructor, PropertyIds::isSafeInteger, &JavascriptNumber::EntryInfo::IsSafeInteger, 1);
        }

        numberConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }